

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O3

vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
* __thiscall
miniros::master::RegistrationManager::getTopicSubscribers
          (vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
           *__return_storage_ptr__,RegistrationManager *this,string *topic)

{
  int iVar1;
  _Base_ptr p_Var2;
  shared_ptr<miniros::master::NodeRef> node;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sub_api;
  undefined1 local_58 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_guard);
  if (iVar1 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Registrations::getApis(&local_48,&this->subscribers,topic);
    for (p_Var2 = (_Base_ptr)
                  local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var2 != (_Base_ptr)
                  local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; p_Var2 = p_Var2 + 1) {
      getNodeByAPIUnsafe((RegistrationManager *)local_58,(string *)this);
      if ((element_type *)local_58._0_8_ != (element_type *)0x0) {
        ::std::
        vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_58);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_guard);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

std::vector<std::shared_ptr<NodeRef>> RegistrationManager::getTopicSubscribers(const std::string& topic) const
{
  std::scoped_lock<std::mutex> lock(m_guard);

  std::vector<std::shared_ptr<NodeRef>> result;
  std::vector<std::string> sub_api = subscribers.getApis(topic);
  for (const auto& api: sub_api) {
    auto node = getNodeByAPIUnsafe(api);
    if (node) {
      result.push_back(node);
    }
  }
  return result;
}